

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O1

void ini_inv(trobj *trop,short *nocreate)

{
  byte bVar1;
  ushort uVar2;
  objclass *poVar3;
  schar sVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  obj *poVar9;
  char *pcVar10;
  long lVar11;
  uint booktype;
  char cVar12;
  short sVar13;
  obj *in_stack_ffffffffffffffb8;
  ulong local_38;
  
  pbVar8 = &trop->field_0x4;
LAB_0027c0aa:
  local_38 = (ulong)(*pbVar8 & 0x3f);
LAB_0027c0b2:
  cVar12 = trop->trclass;
  if (cVar12 == '\0') {
    return;
  }
  sVar5 = trop->trotyp;
  if (sVar5 == 0) {
    do {
      poVar9 = mkobj(level,cVar12,'\0');
      uVar2 = poVar9->otyp;
      booktype = (uint)(short)uVar2;
      if (((((booktype != 0x1c2) && (uVar2 != *nocreate)) && (uVar2 != nocreate[1])) &&
          ((uVar2 != nocreate[2] && (uVar2 != nocreate[3])))) &&
         (uVar2 != 0xaa || flags.elbereth_enabled == '\0')) {
        if (uVar2 < 0x141) {
          if ((1 < uVar2 - 0xab) && (uVar2 != 0x134)) goto LAB_0027c1e5;
        }
        else if (((0x3b < uVar2 - 0x141) ||
                 ((0x800000300000001U >> ((ulong)(uVar2 - 0x141) & 0x3f) & 1) == 0)) &&
                ((uVar2 != 0x1bc && (uVar2 != 0x1c3)))) {
LAB_0027c1e5:
          if ((urole.malenum != 0x160 || uVar2 != 0x157) &&
             (urole.malenum != 0x168 || uVar2 != 0x187)) {
            if (poVar9->oclass != '\n') goto LAB_0027c299;
            if (objects[(int)booktype].oc_oc2 < '\x04') {
              iVar6 = spell_skilltype(booktype);
              pcVar10 = *(char **)&shtypes[6].iprobs[(long)urole.malenum + 0xc].itype;
              cVar12 = *pcVar10;
              while (cVar12 != '\0') {
                pcVar10 = pcVar10 + 2;
                if (iVar6 == cVar12) goto LAB_0027c299;
                cVar12 = *pcVar10;
              }
            }
          }
        }
      }
      dealloc_obj(poVar9);
      cVar12 = trop->trclass;
    } while( true );
  }
  if (urace.malenum != 0x10b) {
    sVar13 = 0x111;
    lVar11 = 6;
    do {
      if ((sVar13 == urace.malenum) && (sVar5 == *(short *)(&Money[1].field_0x4 + lVar11))) {
        sVar5 = *(short *)(&Money[1].field_0x6 + lVar11);
        break;
      }
      sVar13 = *(short *)((long)&inv_subs[0].race_pm + lVar11);
      lVar11 = lVar11 + 6;
    } while (lVar11 != 0x96);
  }
  booktype = (uint)sVar5;
  poVar9 = mksobj(level,booktype,'\x01','\0');
  goto LAB_0027c369;
LAB_0027c299:
  if (((objects[(int)booktype].field_0x10 & 0x20) != 0) && (poVar9->spe < '\x01')) {
    iVar6 = 1;
    do {
      uVar7 = mt_random();
      if (1 < uVar7 % 5) {
        sVar4 = (schar)iVar6;
        goto LAB_0027c312;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 10);
    sVar4 = '\n';
LAB_0027c312:
    poVar9->spe = sVar4;
  }
  if (uVar2 < 0x13a) {
    if (uVar2 == 0xb7) {
LAB_0027c351:
      *nocreate = 0xb8;
    }
    else if (uVar2 == 0xb8) {
      nocreate[0] = 0xb7;
      nocreate[1] = 0x19e;
      nocreate[2] = 0x13a;
    }
  }
  else if ((uVar2 == 0x1c9) || (uVar2 == 0x13a)) goto LAB_0027c351;
  if ((poVar9->oclass == '\n') || (poVar9->oclass == '\x04')) {
    nocreate[3] = uVar2;
  }
LAB_0027c369:
  if (trop->trclass == '\f') {
    poVar9->quan = u.umoney0;
  }
  else {
    uVar7 = *(uint *)&poVar9->field_0x4a;
    *(uint *)&poVar9->field_0x4a = uVar7 | 0xe0;
    if ((objects[(int)booktype].field_0x10 & 4) != 0) {
      *(uint *)&poVar9->field_0x4a = uVar7 | 0xf0;
    }
    poVar9->field_0x4a = poVar9->field_0x4a & 0xfe;
    if (poVar9->oprops != 0) {
      poVar9->oprops = 0;
    }
    if (((short)*(uint *)&poVar9->field_0x4a < 0) && (u.ualign.type != -1)) {
      *(uint *)&poVar9->field_0x4a = *(uint *)&poVar9->field_0x4a & 0xffff7fff;
    }
    cVar12 = poVar9->oclass;
    if (cVar12 == '\x02') {
LAB_0027c40c:
      iVar6 = (int)local_38;
      local_38 = 1;
LAB_0027c41b:
      poVar9->quan = iVar6;
    }
    else if (cVar12 == '\r') {
      iVar6 = 1;
      if (0xfffc < (ushort)(poVar9->otyp - 0x212U)) goto LAB_0027c41b;
    }
    else if (cVar12 == '\x06') goto LAB_0027c40c;
    if (poVar9->otyp == 0x7a) {
      poVar9->field_0x4a = poVar9->field_0x4a | 1;
    }
    if (trop->trspe != '\x7f') {
      poVar9->spe = trop->trspe;
    }
    uVar7 = (uint)((byte)trop->field_0x4 >> 6);
    if (uVar7 != 2) {
      *(uint *)&poVar9->field_0x4a = (*(uint *)&poVar9->field_0x4a & 0xfffffffd) + (uVar7 & 1) * 2;
    }
  }
  uVar7 = weight(poVar9);
  poVar9->owt = uVar7;
  poVar9 = addinv(in_stack_ffffffffffffffb8);
  if ((obj_descr[objects[(int)booktype].oc_descr_idx].oc_descr != (char *)0x0) &&
     ((poVar9->field_0x4a & 0x10) != 0)) {
    discover_object(booktype,'\x01','\0');
    objects[(int)booktype].field_0x10 = objects[(int)booktype].field_0x10 | 8;
  }
  discover_object(0x142,'\x01','\0');
  poVar3 = objects;
  objects[0x142].field_0x10 = objects[0x142].field_0x10 | 8;
  if ((poVar9->oclass == '\x03') && (u.roleplay.nudist == '\0')) {
    cVar12 = poVar3[poVar9->otyp].oc_subtyp;
    if ((cVar12 == '\x01') && (uarms == (obj *)0x0)) {
      setworn(poVar9,8);
      if (uswapwep != (obj *)0x0) {
        setuswapwep((obj *)0x0);
      }
    }
    else {
      if ((cVar12 == '\x02') && (uarmh == (obj *)0x0)) {
        lVar11 = 4;
      }
      else if ((cVar12 == '\x03') && (uarmg == (obj *)0x0)) {
        lVar11 = 0x10;
      }
      else if ((cVar12 == '\x06') && (uarmu == (obj *)0x0)) {
        lVar11 = 0x40;
      }
      else if ((cVar12 == '\x05') && (uarmc == (obj *)0x0)) {
        lVar11 = 2;
      }
      else if ((cVar12 == '\x04') && (uarmf == (obj *)0x0)) {
        lVar11 = 0x20;
      }
      else {
        if ((cVar12 != '\0') || (uarm != (obj *)0x0)) goto LAB_0027c574;
        lVar11 = 1;
      }
      setworn(poVar9,lVar11);
    }
  }
LAB_0027c574:
  bVar1 = poVar9->oclass;
  if (bVar1 == 2) {
LAB_0027c5c6:
    if ((byte)(objects[poVar9->otyp].oc_subtyp + 0x18U) < 3) {
LAB_0027c602:
      if (uquiver == (obj *)0x0) {
        setuqwep(poVar9);
      }
      goto LAB_0027c66b;
    }
    if ((bVar1 | 4) == 6) {
LAB_0027c5e9:
      if (((byte)(objects[poVar9->otyp].oc_subtyp + 0x1bU) < 3) ||
         ((bVar1 == 2 && (1 < poVar9->quan)))) goto LAB_0027c602;
    }
  }
  else {
    if (bVar1 == 6) {
      if ((booktype != 0xf4) && (objects[poVar9->otyp].oc_subtyp == '\0')) {
LAB_0027c5a8:
        if ((booktype & 0xfffffffe) != 0x212) goto LAB_0027c66b;
      }
    }
    else if (booktype != 0xf4) goto LAB_0027c5a8;
    if (bVar1 == 0xd) goto LAB_0027c5c6;
    if (bVar1 == 6) goto LAB_0027c5e9;
    if (bVar1 == 2) goto LAB_0027c5c6;
  }
  if ((uwep == (obj *)0x0) && (u.roleplay.pacifist == '\0')) {
    setuwep(poVar9);
  }
  else if (uswapwep == (obj *)0x0) {
    setuswapwep(poVar9);
  }
LAB_0027c66b:
  if ((poVar9->oclass == '\n') && (poVar9->otyp != 0x1bc)) {
    initialspell(poVar9);
  }
  if ((poVar9->otyp == 0xee) && (u.roleplay.blindfolded != '\0')) {
    setworn(poVar9,0x80000);
  }
  local_38 = local_38 - 1;
  if (local_38 == 0) goto LAB_0027c797;
  goto LAB_0027c0b2;
LAB_0027c797:
  pbVar8 = &trop[1].field_0x4;
  trop = trop + 1;
  goto LAB_0027c0aa;
}

Assistant:

static void ini_inv(const struct trobj *trop, short nocreate[4])
{
	struct obj *obj;
	int otyp, i;
	long trquan = trop->trquan;

	while (trop->trclass) {
		if (trop->trotyp != UNDEF_TYP) {
			otyp = (int)trop->trotyp;
			if (urace.malenum != PM_HUMAN) {
			    /* substitute specific items for generic ones */
			    for (i = 0; inv_subs[i].race_pm != NON_PM; ++i)
				if (inv_subs[i].race_pm == urace.malenum &&
					otyp == inv_subs[i].item_otyp) {
				    otyp = inv_subs[i].subs_otyp;
				    break;
				}
			}
			obj = mksobj(level, otyp, TRUE, FALSE);
		} else {	/* UNDEF_TYP */
		/*
		 * For random objects, do not create certain overly powerful
		 * items: wand of wishing, ring of levitation, or the
		 * polymorph/polymorph control combination.  Specific objects,
		 * i.e. the discovery wishing, are still OK.
		 * Also, don't get a couple of really useless items.  (Note:
		 * punishment isn't "useless".  Some players who start out with
		 * one will immediately read it and use the iron ball as a
		 * weapon.)
		 */
			obj = mkobj(level, trop->trclass, FALSE);
			otyp = obj->otyp;
			while (otyp == WAN_WISHING
				|| otyp == nocreate[0]
				|| otyp == nocreate[1]
				|| otyp == nocreate[2]
				|| otyp == nocreate[3]
				|| (otyp == RIN_LEVITATION && flags.elbereth_enabled)
				/* 'useless' items */
				|| otyp == POT_HALLUCINATION
				|| otyp == POT_ACID
				|| otyp == SCR_FLOOD
				|| otyp == SCR_FIRE
				|| otyp == SCR_BLANK_PAPER
				|| otyp == SPE_BLANK_PAPER
				|| otyp == RIN_AGGRAVATE_MONSTER
				|| otyp == RIN_HUNGER
				|| otyp == WAN_NOTHING
				/* Monks don't use weapons */
				|| (otyp == SCR_ENCHANT_WEAPON &&
				    Role_if (PM_MONK))
				/* wizard patch -- they already have one */
				|| (otyp == SPE_FORCE_BOLT &&
				    Role_if (PM_WIZARD))
				/* powerful spells are either useless to
				   low level players or unbalancing; also
				   spells in restricted skill categories */
				|| (obj->oclass == SPBOOK_CLASS &&
				    (objects[otyp].oc_level > 3 ||
				    restricted_spell_discipline(otyp)))
							) {
				dealloc_obj(obj);
				obj = mkobj(level, trop->trclass, FALSE);
				otyp = obj->otyp;
			}

			/* Don't start with +0 or negative rings */
			if (objects[otyp].oc_charged && obj->spe <= 0)
				obj->spe = rne(3);

			/* Heavily relies on the fact that 1) we create wands
			 * before rings, 2) that we create rings before
			 * spellbooks, and that 3) not more than 1 object of a
			 * particular symbol is to be prohibited.  (For more
			 * objects, we need more nocreate variables...)
			 */
			switch (otyp) {
			    case WAN_POLYMORPH:
			    case RIN_POLYMORPH:
			    case POT_POLYMORPH:
				nocreate[0] = RIN_POLYMORPH_CONTROL;
				break;
			    case RIN_POLYMORPH_CONTROL:
				nocreate[0] = RIN_POLYMORPH;
				nocreate[1] = SPE_POLYMORPH;
				nocreate[2] = POT_POLYMORPH;
			}
			/* Don't have 2 of the same ring or spellbook */
			if (obj->oclass == RING_CLASS ||
			    obj->oclass == SPBOOK_CLASS)
				nocreate[3] = otyp;
		}

		if (trop->trclass == COIN_CLASS) {
			/* no "blessed" or "identified" money */
			obj->quan = u.umoney0;
		} else {
			obj->dknown = obj->bknown = obj->rknown = 1;
			if (objects[otyp].oc_uses_known) obj->known = 1;
			obj->cursed = 0;
			if (obj->oprops) obj->oprops = 0L;
			if (obj->opoisoned && u.ualign.type != A_CHAOTIC)
			    obj->opoisoned = 0;
			if (obj->oclass == WEAPON_CLASS ||
				obj->oclass == TOOL_CLASS) {
			    obj->quan = trquan;
			    trquan = 1;
			} else if (obj->oclass == GEM_CLASS &&
				is_graystone(obj) && obj->otyp != FLINT) {
			    obj->quan = 1L;
			}
			if (obj->otyp == STRIPED_SHIRT)
			    obj->cursed = TRUE;
			if (trop->trspe != UNDEF_SPE)
			    obj->spe = trop->trspe;
			if (trop->trbless != UNDEF_BLESS)
			    obj->blessed = trop->trbless;
		}
		/* defined after setting otyp+quan + blessedness */
		obj->owt = weight(obj);
		obj = addinv(obj);

		/* Make the type known if necessary */
		if (OBJ_DESCR(objects[otyp]) && obj->known)
			knows_object(otyp);

		/* pre-ID oil as it's easy to check anyway */
		knows_object(POT_OIL);

		if (obj->oclass == ARMOR_CLASS && !u.roleplay.nudist) {
			if (is_shield(obj) && !uarms) {
				setworn(obj, W_ARMS);
				if (uswapwep) setuswapwep(NULL);
			} else if (is_helmet(obj) && !uarmh)
				setworn(obj, W_ARMH);
			else if (is_gloves(obj) && !uarmg)
				setworn(obj, W_ARMG);
			else if (is_shirt(obj) && !uarmu)
				setworn(obj, W_ARMU);
			else if (is_cloak(obj) && !uarmc)
				setworn(obj, W_ARMC);
			else if (is_boots(obj) && !uarmf)
				setworn(obj, W_ARMF);
			else if (is_suit(obj) && !uarm)
				setworn(obj, W_ARM);
		}

		if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
			otyp == TIN_OPENER || otyp == FLINT || otyp == ROCK) {
		    if (is_ammo(obj) || is_missile(obj) ||
			/* starting weapon stacks are usually for throwing */
			(obj->oclass == WEAPON_CLASS && obj->quan > 1)) {
			if (!uquiver) setuqwep(obj);
		    } else if (!uwep && !u.roleplay.pacifist) setuwep(obj);
		    else if (!uswapwep) setuswapwep(obj);
		}
		if (obj->oclass == SPBOOK_CLASS &&
				obj->otyp != SPE_BLANK_PAPER)
		    initialspell(obj);

		if (obj->otyp == BLINDFOLD && u.roleplay.blindfolded)
		    setworn(obj, W_TOOL);

		if (--trquan) continue;	/* make a similar object */
		trop++;
		trquan = trop->trquan;
	}
}